

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::ipc::HostImpl::ExposedService::ExposedService
          (ExposedService *this,ExposedService *param_1)

{
  this->id = param_1->id;
  ::std::__cxx11::string::string((string *)&this->name,(string *)&param_1->name);
  (this->instance)._M_t.
  super___uniq_ptr_impl<perfetto::ipc::Service,_std::default_delete<perfetto::ipc::Service>_>._M_t.
  super__Tuple_impl<0UL,_perfetto::ipc::Service_*,_std::default_delete<perfetto::ipc::Service>_>.
  super__Head_base<0UL,_perfetto::ipc::Service_*,_false>._M_head_impl =
       (param_1->instance)._M_t.
       super___uniq_ptr_impl<perfetto::ipc::Service,_std::default_delete<perfetto::ipc::Service>_>.
       _M_t.
       super__Tuple_impl<0UL,_perfetto::ipc::Service_*,_std::default_delete<perfetto::ipc::Service>_>
       .super__Head_base<0UL,_perfetto::ipc::Service_*,_false>._M_head_impl;
  (param_1->instance)._M_t.
  super___uniq_ptr_impl<perfetto::ipc::Service,_std::default_delete<perfetto::ipc::Service>_>._M_t.
  super__Tuple_impl<0UL,_perfetto::ipc::Service_*,_std::default_delete<perfetto::ipc::Service>_>.
  super__Head_base<0UL,_perfetto::ipc::Service_*,_false>._M_head_impl = (Service *)0x0;
  return;
}

Assistant:

HostImpl::ExposedService::ExposedService(ExposedService&&) noexcept = default;